

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkQueue.c
# Opt level: O1

queue * createQueue(size_t max_elements)

{
  queue *pqVar1;
  chunk **__s;
  
  pqVar1 = (queue *)calloc(1,0x28);
  pqVar1->capacity = max_elements;
  pqVar1->size = 0;
  pqVar1->head = 1;
  pqVar1->tail = 0;
  __s = (chunk **)calloc(max_elements,8);
  pqVar1->elements = __s;
  if (max_elements != 0) {
    memset(__s,0,max_elements << 3);
  }
  return pqVar1;
}

Assistant:

queue* createQueue(const size_t max_elements)
{
    queue* q = NULL;
    q = calloc(1, sizeof(queue));
    q->capacity = max_elements;
    q->size = 0;
    q->head = 1;
    q->tail = 0;
    q->elements = calloc(max_elements, sizeof(chunk*));

    for (size_t s=0; s<max_elements; ++s)
    {
        q->elements[s] = NULL;
    }

    return q;
}